

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O2

ChNodeFEAcurv * __thiscall
chrono::fea::ChNodeFEAcurv::operator=(ChNodeFEAcurv *this,ChNodeFEAcurv *other)

{
  if (other != this) {
    ChNodeFEAbase::operator=(&this->super_ChNodeFEAbase,&other->super_ChNodeFEAbase);
    ChVariablesGenericDiagonalMass::operator=
              (*(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAbase).field_0x18,
               *(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAbase).field_0x18);
    *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x20 =
         *(undefined8 *)&(other->super_ChNodeFEAbase).field_0x20;
    *(undefined8 *)&this->field_0x28 = *(undefined8 *)&other->field_0x28;
    *(undefined8 *)&this->field_0x30 = *(undefined8 *)&other->field_0x30;
    (this->m_ryy).m_data[0] = (other->m_ryy).m_data[0];
    (this->m_ryy).m_data[1] = (other->m_ryy).m_data[1];
    (this->m_ryy).m_data[2] = (other->m_ryy).m_data[2];
    (this->m_rzz).m_data[0] = (other->m_rzz).m_data[0];
    (this->m_rzz).m_data[1] = (other->m_rzz).m_data[1];
    (this->m_rzz).m_data[2] = (other->m_rzz).m_data[2];
    (this->m_rxx_dt).m_data[0] = (other->m_rxx_dt).m_data[0];
    (this->m_rxx_dt).m_data[1] = (other->m_rxx_dt).m_data[1];
    (this->m_rxx_dt).m_data[2] = (other->m_rxx_dt).m_data[2];
    (this->m_ryy_dt).m_data[0] = (other->m_ryy_dt).m_data[0];
    (this->m_ryy_dt).m_data[1] = (other->m_ryy_dt).m_data[1];
    (this->m_ryy_dt).m_data[2] = (other->m_ryy_dt).m_data[2];
    (this->m_rzz_dt).m_data[0] = (other->m_rzz_dt).m_data[0];
    (this->m_rzz_dt).m_data[1] = (other->m_rzz_dt).m_data[1];
    (this->m_rzz_dt).m_data[2] = (other->m_rzz_dt).m_data[2];
    (this->m_rxx_dtdt).m_data[0] = (other->m_rxx_dtdt).m_data[0];
    (this->m_rxx_dtdt).m_data[1] = (other->m_rxx_dtdt).m_data[1];
    (this->m_rxx_dtdt).m_data[2] = (other->m_rxx_dtdt).m_data[2];
    (this->m_ryy_dtdt).m_data[0] = (other->m_ryy_dtdt).m_data[0];
    (this->m_ryy_dtdt).m_data[1] = (other->m_ryy_dtdt).m_data[1];
    (this->m_ryy_dtdt).m_data[2] = (other->m_ryy_dtdt).m_data[2];
    (this->m_rzz_dtdt).m_data[0] = (other->m_rzz_dtdt).m_data[0];
    (this->m_rzz_dtdt).m_data[1] = (other->m_rzz_dtdt).m_data[1];
    (this->m_rzz_dtdt).m_data[2] = (other->m_rzz_dtdt).m_data[2];
  }
  return this;
}

Assistant:

ChNodeFEAcurv& ChNodeFEAcurv::operator=(const ChNodeFEAcurv& other) {
    if (&other == this)
        return *this;

    ChNodeFEAbase::operator=(other);

    *m_variables = *other.m_variables;
    m_rxx = other.m_rxx;
    m_ryy = other.m_ryy;
    m_rzz = other.m_rzz;
    m_rxx_dt = other.m_rxx_dt;
    m_ryy_dt = other.m_ryy_dt;
    m_rzz_dt = other.m_rzz_dt;
    m_rxx_dtdt = other.m_rxx_dtdt;
    m_ryy_dtdt = other.m_ryy_dtdt;
    m_rzz_dtdt = other.m_rzz_dtdt;

    return *this;
}